

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool mips_cpu_exec_interrupt_mips64el(CPUState *cs,int interrupt_request)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  
  if (((((interrupt_request & 2U) != 0) &&
       (uVar3 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10a4), (uVar3 & 7) == 1)) &&
      ((*(byte *)((long)cs[1].tb_jmp_cache + 0x485c) & 4) == 0)) &&
     ((*(byte *)((long)cs[1].tb_jmp_cache + 0xb89) & 4) == 0)) {
    uVar1 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10b4);
    uVar3 = uVar3 & 0xff00;
    bVar2 = (uVar1 & uVar3) != 0;
    if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x10ec) & 0x40) != 0) {
      bVar2 = uVar3 < (uVar1 & 0xff00);
    }
    if (bVar2) {
      cs->exception_index = 8;
      *(undefined4 *)(cs[1].tb_jmp_cache + 0x90b) = 0;
      mips_cpu_do_interrupt_mips64el(cs);
      return true;
    }
  }
  return false;
}

Assistant:

bool mips_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        MIPSCPU *cpu = MIPS_CPU(cs);
        CPUMIPSState *env = &cpu->env;

        if (cpu_mips_hw_interrupts_enabled(env) &&
            cpu_mips_hw_interrupts_pending(env)) {
            /* Raise it */
            cs->exception_index = EXCP_EXT_INTERRUPT;
            env->error_code = 0;
            mips_cpu_do_interrupt(cs);
            return true;
        }
    }
    return false;
}